

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O1

void __thiscall
ProtoHandler::OnRemoveBreakPointReq(ProtoHandler *this,RemoveBreakpointParams *params)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EmmyDebuggerManager *this_01;
  pointer psVar3;
  
  this_01 = EmmyFacade::GetDebugManager(this->_owner);
  psVar1 = (params->breakPoints).
           super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (params->breakPoints).
                super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar3->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    EmmyDebuggerManager::RemoveBreakpoint(this_01,&peVar2->file,peVar2->line);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void ProtoHandler::OnRemoveBreakPointReq(RemoveBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	for (auto bp: params.breakPoints) {
		manager.RemoveBreakpoint(bp->file, bp->line);
	}
}